

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

Bool_conflict CPU_Is_InOrder(void)

{
  Bool_conflict BVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  UInt32 model;
  UInt32 family;
  int firm;
  Cx86cpuid p;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  Cx86cpuid local_24;
  uint local_4;
  
  BVar1 = x86cpuid_CheckAndRead((Cx86cpuid *)0x9f16de);
  if (BVar1 == 0) {
    local_4 = 1;
  }
  else {
    uVar2 = local_24.ver >> 0x10 & 0xff0 | local_24.ver >> 8 & 0xf;
    uVar3 = local_24.ver >> 0xc & 0xf0 | local_24.ver >> 4 & 0xf;
    iVar4 = x86cpuid_GetFirm(&local_24);
    if (iVar4 == 0) {
      local_35 = true;
      if (5 < uVar2) {
        local_36 = false;
        if (uVar2 == 6) {
          local_37 = true;
          if ((((uVar3 != 0x1c) && (local_37 = true, uVar3 != 0x26)) &&
              (local_37 = true, uVar3 != 0x27)) && (local_37 = true, uVar3 != 0x35)) {
            local_37 = uVar3 == 0x36;
          }
          local_36 = local_37;
        }
        local_35 = local_36;
      }
      local_4 = (uint)local_35;
    }
    else if (iVar4 == 1) {
      local_38 = true;
      if (4 < uVar2) {
        local_39 = false;
        if (uVar2 == 5) {
          local_3a = uVar3 < 6 || uVar3 == 10;
          local_39 = local_3a;
        }
        local_38 = local_39;
      }
      local_4 = (uint)local_38;
    }
    else if (iVar4 == 2) {
      local_3b = true;
      if (5 < uVar2) {
        local_3c = uVar2 == 6 && uVar3 < 0xf;
        local_3b = local_3c;
      }
      local_4 = (uint)local_3b;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

Bool CPU_Is_InOrder()
{
  Cx86cpuid p;
  int firm;
  UInt32 family, model;
  if (!x86cpuid_CheckAndRead(&p))
    return True;

  family = x86cpuid_GetFamily(p.ver);
  model = x86cpuid_GetModel(p.ver);
  
  firm = x86cpuid_GetFirm(&p);

  switch (firm)
  {
    case CPU_FIRM_INTEL: return (family < 6 || (family == 6 && (
        /* In-Order Atom CPU */
           model == 0x1C  /* 45 nm, N4xx, D4xx, N5xx, D5xx, 230, 330 */
        || model == 0x26  /* 45 nm, Z6xx */
        || model == 0x27  /* 32 nm, Z2460 */
        || model == 0x35  /* 32 nm, Z2760 */
        || model == 0x36  /* 32 nm, N2xxx, D2xxx */
        )));
    case CPU_FIRM_AMD: return (family < 5 || (family == 5 && (model < 6 || model == 0xA)));
    case CPU_FIRM_VIA: return (family < 6 || (family == 6 && model < 0xF));
  }
  return True;
}